

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::diffuse_Ssync
          (Diffusion *this,MultiFab *Ssync,int sigma,int nComp,Real dt,Real be_cn_theta,
          MultiFab *rho_half,int rho_flag,MultiFab **flux,int fluxComp,MultiFab **beta,int betaComp,
          MultiFab *alpha,int alphaComp)

{
  initializer_list<amrex::Geometry> iVar1;
  initializer_list<amrex::BoxArray> iVar2;
  initializer_list<amrex::DistributionMapping> iVar3;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> iVar4;
  initializer_list<amrex::MultiFab_*> iVar5;
  initializer_list<const_amrex::MultiFab_*> iVar6;
  bool bVar7;
  int iVar8;
  FabFactory<amrex::FArrayBox> *pFVar9;
  BoxArray *rhs;
  Geometry *__src;
  MultiFab *pMVar10;
  Print *this_00;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  MLLinOp *in_R8;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  Real run_time;
  int IOProc;
  Array4<const_double> *rho_arr;
  Array4<double> *ssync_arr;
  Box *bx_1;
  MFIter mfi_1;
  MultiFab *S_new_1;
  Real s_norm;
  int comp_2;
  int flux_allnull;
  int flux_allthere;
  Array4<const_double> *rhoh_arr;
  Array4<double> *rhs_arr;
  Box *bx;
  MFIter mfi;
  MLMG mlmg;
  int Rho_comp;
  MultiFab *rho;
  MultiFab *S;
  Real cur_time;
  pair<double,_double> scalars;
  MultiFab acoef;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  MLEBABecLap mlabec;
  EBFArrayBoxFactory **ebf;
  LPInfo info;
  MultiFab Soln;
  Real S_tol_abs;
  Real S_tol;
  Real rhsscale;
  Real b;
  Real a;
  Real r_norm;
  int comp_1;
  MultiFab *S_new;
  MultiFab junk;
  MultiFab Rhs;
  int allthere;
  Real strt_time;
  int comp;
  int state_ind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe488;
  undefined8 uVar11;
  MLLinOp *a_lp;
  undefined4 in_stack_ffffffffffffe490;
  int in_stack_ffffffffffffe494;
  undefined4 in_stack_ffffffffffffe498;
  int in_stack_ffffffffffffe49c;
  MLEBABecLap *in_stack_ffffffffffffe4a0;
  array<amrex::LinOpBCType,_3UL> *in_stack_ffffffffffffe4a8;
  AmrLevel *in_stack_ffffffffffffe4b0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_ffffffffffffe4b8;
  Print *in_stack_ffffffffffffe4c0;
  BoxArray *in_stack_ffffffffffffe4c8;
  undefined4 in_stack_ffffffffffffe4d0;
  undefined4 in_stack_ffffffffffffe4d4;
  int iVar12;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  *in_stack_ffffffffffffe4d8;
  Print *in_stack_ffffffffffffe4e0;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_ffffffffffffe4e8;
  MLEBABecLap *in_stack_ffffffffffffe4f0;
  Print *in_stack_ffffffffffffe500;
  MultiFab *in_stack_ffffffffffffe508;
  undefined4 in_stack_ffffffffffffe510;
  undefined4 in_stack_ffffffffffffe514;
  Real in_stack_ffffffffffffe518;
  Real in_stack_ffffffffffffe520;
  pair<double,_double> *in_stack_ffffffffffffe528;
  MultiFab *in_stack_ffffffffffffe530;
  MultiFab *in_stack_ffffffffffffe540;
  MLMG *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_1a60;
  undefined8 *local_1a48;
  undefined1 in_stack_ffffffffffffe7ae;
  undefined1 in_stack_ffffffffffffe7af;
  int in_stack_ffffffffffffe7b0;
  int in_stack_ffffffffffffe7b4;
  MultiFab *in_stack_ffffffffffffe7b8;
  char *in_stack_ffffffffffffe818;
  Real in_stack_ffffffffffffe820;
  Real in_stack_ffffffffffffe828;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
  *in_stack_ffffffffffffe830;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_ffffffffffffe838;
  MLMG *in_stack_ffffffffffffe840;
  double local_17b8;
  int local_17ac;
  undefined1 local_17a8 [64];
  undefined1 auStack_1768 [64];
  undefined1 local_1728 [64];
  undefined1 *local_16e8;
  undefined1 local_16e0 [64];
  undefined8 in_stack_ffffffffffffe960;
  undefined1 *__src_00;
  MultiFab **in_stack_ffffffffffffe968;
  MLEBABecLap *in_stack_ffffffffffffe970;
  MFIter local_1670;
  MultiFab *local_1610;
  undefined1 local_1601;
  Real local_1478;
  int local_1470;
  int local_1468;
  undefined1 *local_1460;
  undefined1 **local_1458;
  undefined8 local_1450;
  FabArrayBase *local_1428;
  FabArrayBase **local_1420;
  undefined8 local_1418;
  undefined1 local_13f8 [64];
  undefined8 local_13b8;
  int local_13b0;
  undefined1 auStack_13a8 [56];
  MultiFab *in_stack_ffffffffffffec90;
  MultiFab *in_stack_ffffffffffffec98;
  MultiFab *in_stack_ffffffffffffeca0;
  MultiFab *in_stack_ffffffffffffeca8;
  int in_stack_ffffffffffffecb4;
  MLCellLinOp *in_stack_ffffffffffffecb8;
  undefined1 local_1320 [64];
  undefined1 *local_12e0;
  undefined1 local_12d4 [28];
  undefined1 *local_12b8;
  MFIter local_12b0;
  MLMG local_1250;
  int local_10b4;
  MLLinOp *local_10b0;
  MLLinOp *local_10a8;
  Real local_10a0;
  pair<double,_double> local_1098 [27];
  _func_int **fac;
  undefined8 uVar13;
  undefined8 in_stack_fffffffffffff130;
  undefined8 in_stack_fffffffffffff138;
  undefined8 in_stack_fffffffffffff140;
  undefined8 local_eb0 [2];
  undefined8 local_ea0;
  element_type *local_e98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_e68 [6];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e00;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_df8;
  undefined1 local_dd0 [200];
  undefined1 *local_d08;
  undefined8 local_d00;
  MLLinOp local_ce0 [2];
  Real local_908;
  Real *local_900;
  LPInfo local_8f8;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  FabArrayBase local_8a8;
  undefined8 local_728;
  Real local_720;
  undefined8 local_718;
  double local_710;
  undefined8 local_708;
  undefined1 local_6f9;
  Real local_570;
  int local_564;
  MultiFab *local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined1 local_378 [392];
  double local_1f0;
  undefined1 local_1e5;
  int local_4c;
  int local_48;
  int local_44;
  MLLinOp *local_40;
  double local_38;
  double local_30;
  int local_28;
  undefined4 local_c;
  int *local_8;
  
  local_30 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_48 = in_EDX + 3;
  local_44 = in_R9D;
  local_40 = in_R8;
  local_38 = in_XMM1_Qa;
  local_28 = in_ECX;
  if (verbose != 0) {
    for (local_4c = 0; local_4c < local_28; local_4c = local_4c + 1) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe4c0,(ostream *)in_stack_ffffffffffffe4b8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (char (*) [31])in_stack_ffffffffffffe488);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (int *)in_stack_ffffffffffffe488);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (char (*) [2])in_stack_ffffffffffffe488);
      amrex::AmrLevel::get_desc_lst();
      amrex::DescriptorList::operator[]
                ((DescriptorList *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (int)((ulong)in_stack_ffffffffffffe488 >> 0x20));
      amrex::StateDescriptor::name_abi_cxx11_
                ((StateDescriptor *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (int)((ulong)in_stack_ffffffffffffe488 >> 0x20));
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 in_stack_ffffffffffffe488);
      local_1e5 = 10;
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (char *)in_stack_ffffffffffffe488);
      amrex::Print::~Print(in_stack_ffffffffffffe500);
    }
  }
  local_1f0 = amrex::ParallelDescriptor::second();
  checkBeta((Diffusion *)CONCAT44(in_stack_ffffffffffffe49c,in_stack_ffffffffffffe498),
            (MultiFab **)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
            (int *)in_stack_ffffffffffffe488);
  local_398 = 0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_388 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x868235);
  amrex::AmrLevel::Factory
            ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490));
  amrex::MultiFab::MultiFab
            ((MultiFab *)CONCAT44(in_stack_ffffffffffffe4d4,in_stack_ffffffffffffe4d0),
             in_stack_ffffffffffffe4c8,(DistributionMapping *)in_stack_ffffffffffffe4c0,
             (int)((ulong)in_stack_ffffffffffffe4b8 >> 0x20),(int)in_stack_ffffffffffffe4b8,
             (MFInfo *)in_stack_ffffffffffffe4b0,
             (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe4e0);
  amrex::MFInfo::~MFInfo((MFInfo *)0x86828d);
  amrex::MultiFab::Copy
            ((MultiFab *)in_stack_ffffffffffffe4c0,(MultiFab *)in_stack_ffffffffffffe4b8,
             (int)((ulong)in_stack_ffffffffffffe4b0 >> 0x20),(int)in_stack_ffffffffffffe4b0,
             (int)((ulong)in_stack_ffffffffffffe4a8 >> 0x20),(int)in_stack_ffffffffffffe4a8);
  if (1 < verbose) {
    local_548 = 0;
    uStack_540 = 0;
    local_558 = 0;
    uStack_550 = 0;
    local_538 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x868328);
    pFVar9 = amrex::AmrLevel::Factory
                       ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490));
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(in_stack_ffffffffffffe4d4,in_stack_ffffffffffffe4d0),
               in_stack_ffffffffffffe4c8,(DistributionMapping *)in_stack_ffffffffffffe4c0,
               (int)((ulong)in_stack_ffffffffffffe4b8 >> 0x20),(int)in_stack_ffffffffffffe4b8,
               (MFInfo *)in_stack_ffffffffffffe4b0,
               (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe4e0);
    amrex::MFInfo::~MFInfo((MFInfo *)0x868380);
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_ffffffffffffe4c0,(MultiFab *)in_stack_ffffffffffffe4b8,
               (int)((ulong)in_stack_ffffffffffffe4b0 >> 0x20),(int)in_stack_ffffffffffffe4b0,
               (int)((ulong)in_stack_ffffffffffffe4a8 >> 0x20),(int)in_stack_ffffffffffffe4a8);
    local_560 = amrex::AmrLevel::get_new_data
                          ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490)
                           ,(int)((ulong)pFVar9 >> 0x20));
    for (local_564 = 0; local_564 < local_28; local_564 = local_564 + 1) {
      if (local_44 == 2) {
        amrex::MultiFab::Divide
                  ((MultiFab *)in_stack_ffffffffffffe4c0,(MultiFab *)in_stack_ffffffffffffe4b8,
                   (int)((ulong)in_stack_ffffffffffffe4b0 >> 0x20),(int)in_stack_ffffffffffffe4b0,
                   (int)((ulong)in_stack_ffffffffffffe4a8 >> 0x20),(int)in_stack_ffffffffffffe4a8);
      }
      local_570 = amrex::MultiFab::norm0
                            (in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b4,
                             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af,
                             (bool)in_stack_ffffffffffffe7ae);
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe4c0,(ostream *)in_stack_ffffffffffffe4b8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (char (*) [31])pFVar9);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (int *)pFVar9);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (char (*) [3])pFVar9);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (double *)pFVar9);
      local_6f9 = 10;
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
                 (char *)pFVar9);
      amrex::Print::~Print(in_stack_ffffffffffffe500);
    }
    amrex::MultiFab::~MultiFab((MultiFab *)0x8685e8);
  }
  local_708 = 0x3ff0000000000000;
  local_710 = local_38 * local_30;
  local_718 = 0x3ff0000000000000;
  local_720 = visc_tol;
  local_728 = 0xbff0000000000000;
  local_8c8 = 0;
  uStack_8c0 = 0;
  local_8d8 = 0;
  uStack_8d0 = 0;
  local_8b8 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x8686ba);
  rhs = (BoxArray *)
        amrex::AmrLevel::Factory
                  ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490));
  amrex::MultiFab::MultiFab
            ((MultiFab *)CONCAT44(in_stack_ffffffffffffe4d4,in_stack_ffffffffffffe4d0),
             in_stack_ffffffffffffe4c8,(DistributionMapping *)in_stack_ffffffffffffe4c0,
             (int)((ulong)in_stack_ffffffffffffe4b8 >> 0x20),(int)in_stack_ffffffffffffe4b8,
             (MFInfo *)in_stack_ffffffffffffe4b0,
             (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe4e0);
  amrex::MFInfo::~MFInfo((MFInfo *)0x868715);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),(value_type)rhs);
  amrex::LPInfo::LPInfo(&local_8f8);
  amrex::LPInfo::setAgglomeration(&local_8f8,(anonymous_namespace)::agglomeration != 0);
  amrex::LPInfo::setConsolidation(&local_8f8,(anonymous_namespace)::consolidation != 0);
  pFVar9 = amrex::AmrLevel::Factory
                     ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490));
  local_908 = (Real)__dynamic_cast(pFVar9,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                                   &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_908 != 0.0) {
    local_900 = &local_908;
    __src = amrex::AmrLevel::Geom(*(AmrLevel **)(in_RDI + 8));
    memcpy(local_dd0,__src,200);
    local_d00 = 1;
    local_d08 = local_dd0;
    std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x86882d);
    iVar1._M_array._4_4_ = in_stack_ffffffffffffe49c;
    iVar1._M_array._0_4_ = in_stack_ffffffffffffe498;
    iVar1._M_len = (size_type)in_stack_ffffffffffffe4a0;
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),iVar1,
               (allocator_type *)rhs);
    local_e70._M_pi = local_e68;
    amrex::BoxArray::BoxArray
              ((BoxArray *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),rhs);
    local_e00 = local_e68;
    local_df8._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          )(_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            )0x1;
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x8688a8);
    iVar2._M_array._4_4_ = in_stack_ffffffffffffe49c;
    iVar2._M_array._0_4_ = in_stack_ffffffffffffe498;
    iVar2._M_len = (size_type)in_stack_ffffffffffffe4a0;
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),iVar2,
               (allocator_type *)rhs);
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),
               (DistributionMapping *)rhs);
    local_e98 = (element_type *)0x1;
    local_ea0 = local_eb0;
    std::allocator<amrex::DistributionMapping>::allocator
              ((allocator<amrex::DistributionMapping> *)0x868921);
    iVar3._M_array._4_4_ = in_stack_ffffffffffffe49c;
    iVar3._M_array._0_4_ = in_stack_ffffffffffffe498;
    iVar3._M_len = (size_type)in_stack_ffffffffffffe4a0;
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),iVar3,
               (allocator_type *)rhs);
    fac = (_func_int **)*local_900;
    pMVar10 = (MultiFab *)&stack0xfffffffffffff118;
    uVar13 = 1;
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x86898c);
    iVar4._M_array._4_4_ = in_stack_ffffffffffffe49c;
    iVar4._M_array._0_4_ = in_stack_ffffffffffffe498;
    iVar4._M_len = (size_type)in_stack_ffffffffffffe4a0;
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),iVar4,
           (allocator_type *)rhs);
    uVar11 = CONCAT44((int)((ulong)rhs >> 0x20),local_28);
    amrex::MLEBABecLap::MLEBABecLap
              (in_stack_ffffffffffffe4f0,in_stack_ffffffffffffe4e8,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_ffffffffffffe4e0,in_stack_ffffffffffffe4d8,
               (LPInfo *)CONCAT44(in_stack_ffffffffffffe4d4,in_stack_ffffffffffffe4d0),
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)in_stack_ffffffffffffe4c8,(int)in_stack_ffffffffffffe500);
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    ~Vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
             *)0x868a03);
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::~allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x868a10);
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               0x868a1d);
    std::allocator<amrex::DistributionMapping>::~allocator
              ((allocator<amrex::DistributionMapping> *)0x868a2a);
    local_1a48 = &local_ea0;
    do {
      local_1a48 = local_1a48 + -2;
      amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x868a5f);
    } while (local_1a48 != local_eb0);
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x868a89);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x868a96);
    local_1a60 = &local_e00;
    do {
      local_1a60 = local_1a60 + -0xd;
      amrex::BoxArray::~BoxArray
                ((BoxArray *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490));
      iVar8 = (int)((ulong)uVar11 >> 0x20);
    } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a60 != local_e68);
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x868af5);
    std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x868b02);
    amrex::MLLinOp::setMaxOrder(local_ce0,max_order);
    setDomainBC((Diffusion *)in_stack_ffffffffffffe4b0,in_stack_ffffffffffffe4a8,
                (array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffe4a0,
                in_stack_ffffffffffffe49c);
    amrex::MLLinOp::setDomainBC
              ((MLLinOp *)CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510),
               (Array<BCType,_3> *)in_stack_ffffffffffffe508,
               (Array<BCType,_3> *)in_stack_ffffffffffffe500);
    if (0 < *(int *)(in_RDI + 0x20)) {
      local_8 = (int *)(in_RDI + 0x3c);
      local_c = 0;
      amrex::MLLinOp::setCoarseFineBC(local_ce0,(MultiFab *)0x0,*local_8);
    }
    amrex::MLCellLinOp::setLevelBC
              (in_stack_ffffffffffffecb8,in_stack_ffffffffffffecb4,in_stack_ffffffffffffeca8,
               in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,in_stack_ffffffffffffec90);
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490));
    std::pair<double,_double>::pair<double,_double,_true>(local_1098);
    amrex::AmrLevel::get_state_data
              ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe494,in_stack_ffffffffffffe490),iVar8);
    local_10a0 = amrex::StateData::curTime((StateData *)in_stack_ffffffffffffe4b0);
    local_10a8 = (MLLinOp *)
                 amrex::AmrLevel::get_data
                           (in_stack_ffffffffffffe4b0,
                            (int)((ulong)in_stack_ffffffffffffe4a8 >> 0x20),
                            (Real)in_stack_ffffffffffffe4a0);
    a_lp = local_10a8;
    if (local_44 == 1) {
      a_lp = local_40;
    }
    iVar8 = (uint)(local_44 != 1) + (uint)(local_44 != 1) * 2;
    local_10b4 = iVar8;
    local_10b0 = a_lp;
    computeAlpha(in_stack_ffffffffffffe530,in_stack_ffffffffffffe528,in_stack_ffffffffffffe520,
                 in_stack_ffffffffffffe518,
                 (Real *)CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510),
                 in_stack_ffffffffffffe508,(int)((ulong)in_stack_ffffffffffffe500 >> 0x20),
                 (int)in_stack_ffffffffffffe500,in_stack_ffffffffffffe540,(int)a_lp);
    amrex::MLEBABecLap::setScalars
              (in_stack_ffffffffffffe4a0,
               (Real)CONCAT44(in_stack_ffffffffffffe49c,in_stack_ffffffffffffe498),
               (Real)CONCAT44(in_stack_ffffffffffffe494,iVar8));
    amrex::MLEBABecLap::setACoeffs
              (in_stack_ffffffffffffe4a0,in_stack_ffffffffffffe49c,
               (MultiFab *)CONCAT44(in_stack_ffffffffffffe494,iVar8));
    amrex::MultiFab::~MultiFab((MultiFab *)0x868f7b);
    setBeta(in_stack_ffffffffffffe970,in_stack_ffffffffffffe968,
            (int)((ulong)in_stack_ffffffffffffe960 >> 0x20),(int)in_stack_ffffffffffffe960);
    amrex::MLMG::MLMG((MLMG *)CONCAT44(in_stack_ffffffffffffe494,iVar8),a_lp);
    if ((anonymous_namespace)::use_hypre != 0) {
      amrex::MLMG::setBottomSolver(&local_1250,hypre);
      amrex::MLMG::setBottomVerbose(&local_1250,(anonymous_namespace)::hypre_verbose);
    }
    this_01 = &local_1250;
    amrex::MLMG::setMaxFmgIter(this_01,(anonymous_namespace)::max_fmg_iter);
    amrex::MLMG::setVerbose(this_01,verbose);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffe4c0,in_stack_ffffffffffffe4b8,
               SUB81((ulong)in_stack_ffffffffffffe4b0 >> 0x38,0));
    while (bVar7 = amrex::MFIter::isValid(&local_12b0), bVar7) {
      amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffe4f0);
      local_12b8 = local_12d4;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffe49c,in_stack_ffffffffffffe498),
                 (MFIter *)CONCAT44(in_stack_ffffffffffffe494,iVar8));
      local_12e0 = local_1320;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffe49c,in_stack_ffffffffffffe498),
                 (MFIter *)CONCAT44(in_stack_ffffffffffffe494,iVar8));
      memcpy(local_13f8,local_12e0,0x3c);
      local_13b8 = local_718;
      local_13b0 = local_44;
      memcpy(auStack_13a8,&stack0xffffffffffffec98,0x3c);
      amrex::
      ParallelFor<int,Diffusion::diffuse_Ssync(amrex::MultiFab&,int,int,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,int,amrex::MultiFab_const*const*,int,amrex::MultiFab_const*,int)::__0,void>
                ((Box *)in_stack_ffffffffffffe4e0,(int)((ulong)in_stack_ffffffffffffe4d8 >> 0x20),
                 (anon_class_144_4_126c7099 *)
                 CONCAT44(in_stack_ffffffffffffe4d4,in_stack_ffffffffffffe4d0));
      amrex::MFIter::operator++(&local_12b0);
    }
    amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffe494,iVar8));
    local_1428 = &local_8a8;
    local_1420 = &local_1428;
    local_1418 = 1;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x8691fc);
    iVar5._M_array._4_4_ = in_stack_ffffffffffffe49c;
    iVar5._M_array._0_4_ = in_stack_ffffffffffffe498;
    iVar5._M_len = (size_type)in_stack_ffffffffffffe4a0;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_ffffffffffffe494,iVar8),iVar5,(allocator_type *)a_lp);
    local_1460 = local_378;
    local_1458 = &local_1460;
    local_1450 = 1;
    std::allocator<const_amrex::MultiFab_*>::allocator
              ((allocator<const_amrex::MultiFab_*> *)0x869264);
    iVar6._M_array._4_4_ = in_stack_ffffffffffffe49c;
    iVar6._M_array._0_4_ = in_stack_ffffffffffffe498;
    iVar6._M_len = (size_type)in_stack_ffffffffffffe4a0;
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_ffffffffffffe494,iVar8),iVar6,(allocator_type *)a_lp);
    amrex::MLMG::solve(in_stack_ffffffffffffe840,in_stack_ffffffffffffe838,in_stack_ffffffffffffe830
                       ,in_stack_ffffffffffffe828,in_stack_ffffffffffffe820,
                       in_stack_ffffffffffffe818);
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x8692cc
              );
    std::allocator<const_amrex::MultiFab_*>::~allocator
              ((allocator<const_amrex::MultiFab_*> *)0x8692d9);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x8692e6);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x8692f3);
    checkBeta((MultiFab **)CONCAT44(in_stack_ffffffffffffe49c,in_stack_ffffffffffffe498),
              (int *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(int *)a_lp);
    if (local_1468 != 0) {
      computeExtensiveFluxes
                ((MLMG *)in_stack_fffffffffffff140,(MultiFab *)in_stack_fffffffffffff138,
                 (MultiFab **)in_stack_fffffffffffff130,(int)((ulong)uVar13 >> 0x20),(int)uVar13,
                 pMVar10,(Real)fac);
    }
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_ffffffffffffe4c0,(MultiFab *)in_stack_ffffffffffffe4b8,
               (int)((ulong)in_stack_ffffffffffffe4b0 >> 0x20),(int)in_stack_ffffffffffffe4b0,
               (int)((ulong)in_stack_ffffffffffffe4a8 >> 0x20),(int)in_stack_ffffffffffffe4a8);
    do_tiling_ = (undefined1)((ulong)in_stack_ffffffffffffe4b0 >> 0x38);
    if (1 < verbose) {
      for (local_1470 = 0; do_tiling_ = (undefined1)((ulong)in_stack_ffffffffffffe4b0 >> 0x38),
          local_1470 < local_28; local_1470 = local_1470 + 1) {
        amrex::FabArrayBase::nGrow(&local_8a8,0);
        local_1478 = amrex::MultiFab::norm0
                               (in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b4,
                                in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af,
                                (bool)in_stack_ffffffffffffe7ae);
        in_stack_ffffffffffffe500 = (Print *)amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffe4c0,(ostream *)in_stack_ffffffffffffe4b8);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(char (*) [29])a_lp);
        in_stack_ffffffffffffe4f0 =
             (MLEBABecLap *)
             amrex::Print::operator<<
                       ((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(int *)a_lp);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(char (*) [3])a_lp);
        in_stack_ffffffffffffe4e0 =
             amrex::Print::operator<<
                       ((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(double *)a_lp);
        local_1601 = 10;
        amrex::Print::operator<<((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(char *)a_lp);
        amrex::Print::~Print(in_stack_ffffffffffffe500);
      }
    }
    if (local_44 == 2) {
      pMVar10 = amrex::AmrLevel::get_new_data
                          ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe494,iVar8),
                           (int)((ulong)a_lp >> 0x20));
      local_1610 = pMVar10;
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                ((MFIter *)in_stack_ffffffffffffe4c0,in_stack_ffffffffffffe4b8,(bool)do_tiling_);
      while (bVar7 = amrex::MFIter::isValid(&local_1670), bVar7) {
        amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffe4f0);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4a0,
                   (MFIter *)CONCAT44(in_stack_ffffffffffffe49c,in_stack_ffffffffffffe498),
                   in_stack_ffffffffffffe494);
        __src_00 = local_16e0;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe4a0,
                   (MFIter *)CONCAT44(in_stack_ffffffffffffe49c,in_stack_ffffffffffffe498),
                   in_stack_ffffffffffffe494);
        local_16e8 = local_1728;
        iVar12 = local_28;
        memcpy(local_17a8,__src_00,0x3c);
        memcpy(auStack_1768,local_16e8,0x3c);
        amrex::
        ParallelFor<int,Diffusion::diffuse_Ssync(amrex::MultiFab&,int,int,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,int,amrex::MultiFab_const*const*,int,amrex::MultiFab_const*,int)::__1,void>
                  ((Box *)in_stack_ffffffffffffe4e0,(int)((ulong)pMVar10 >> 0x20),
                   (anon_class_128_2_12af2c88 *)CONCAT44(iVar12,in_stack_ffffffffffffe4d0));
        amrex::MFIter::operator++(&local_1670);
      }
      amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffe494,iVar8));
    }
    if (verbose != 0) {
      local_17ac = amrex::ParallelDescriptor::IOProcessorNumber();
      local_17b8 = amrex::ParallelDescriptor::second();
      local_17b8 = local_17b8 - local_1f0;
      amrex::ParallelDescriptor::ReduceRealMax<double>(&local_17b8,local_17ac);
      this_00 = (Print *)amrex::OutStream();
      amrex::Print::Print(this_00,(ostream *)in_stack_ffffffffffffe4b8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(char (*) [34])a_lp);
      amrex::Print::operator<<((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(int *)a_lp);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(char (*) [9])a_lp);
      amrex::Print::operator<<((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(double *)a_lp);
      amrex::Print::operator<<((Print *)CONCAT44(in_stack_ffffffffffffe494,iVar8),(char *)a_lp);
      amrex::Print::~Print(in_stack_ffffffffffffe500);
    }
    amrex::MLMG::~MLMG((MLMG *)CONCAT44(in_stack_ffffffffffffe494,iVar8));
    amrex::MLEBABecLap::~MLEBABecLap((MLEBABecLap *)CONCAT44(in_stack_ffffffffffffe494,iVar8));
    amrex::MultiFab::~MultiFab((MultiFab *)0x869864);
    amrex::MultiFab::~MultiFab((MultiFab *)0x869871);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
Diffusion::diffuse_Ssync (MultiFab&              Ssync,
                          int                    sigma,
                          int                    nComp,
                          Real                   dt,
                          Real                   be_cn_theta,
                          const MultiFab&        rho_half,
                          int                    rho_flag,
                          MultiFab* const*       flux,
                          int                    fluxComp,
                          const MultiFab* const* beta,
                          int                    betaComp,
                          const MultiFab*        alpha,
                          int                    alphaComp)
{
    const int state_ind    = sigma + AMREX_SPACEDIM;
    if (verbose)
    {
       for (int comp = 0; comp < nComp; ++comp) {
          amrex::Print() << "Diffusion::diffuse_Ssync lev: " << level << " "
                         << navier_stokes->get_desc_lst()[State_Type].name(state_ind+comp) << '\n';
       }
    }

    const Real strt_time = ParallelDescriptor::second();

    int allthere;
    checkBeta(beta, allthere);

    MultiFab  Rhs(grids,dmap,nComp,0,MFInfo(),navier_stokes->Factory());

    MultiFab::Copy(Rhs,Ssync,sigma,0,nComp,0);

    if (verbose > 1)
    {
        MultiFab junk(grids,dmap,nComp,0,MFInfo(),navier_stokes->Factory());
        MultiFab::Copy(junk,Rhs,0,0,nComp,0);
        MultiFab& S_new = navier_stokes->get_new_data(State_Type);
        for (int comp = 0; comp < nComp; ++comp) {
            if (rho_flag == 2)
            {
                MultiFab::Divide(junk, S_new, Density, comp, 1, 0);
            }
            Real r_norm = junk.norm0(comp);
            amrex::Print() << "Original max of Ssync of comp " << comp << ": " << r_norm << '\n';
        }
    }
    //
    // SET UP COEFFICIENTS FOR VISCOUS SOLVER.
    //
    const Real  a = 1.0;
    Real        b = be_cn_theta*dt;
    Real rhsscale = 1.0;

    const Real S_tol     = visc_tol;
    const Real S_tol_abs = -1;

    MultiFab Soln(grids,dmap,nComp,1,MFInfo(),navier_stokes->Factory());
    Soln.setVal(0.0);

    LPInfo info;
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);

#ifdef AMREX_USE_EB
    const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
    MLEBABecLap mlabec({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf}, nComp);
#else
    MLABecLaplacian mlabec({navier_stokes->Geom()}, {grids}, {dmap}, info, {}, nComp);
#endif
    mlabec.setMaxOrder(max_order);

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
    setDomainBC(mlmg_lobc, mlmg_hibc, state_ind);

    mlabec.setDomainBC(mlmg_lobc, mlmg_hibc);
    if (level > 0) {
      mlabec.setCoarseFineBC(nullptr, crse_ratio[0]);
    }
    mlabec.setLevelBC(0, nullptr);

    {
      MultiFab acoef;
      std::pair<Real,Real> scalars;
      const Real cur_time = navier_stokes->get_state_data(State_Type).curTime();
      MultiFab& S = navier_stokes->get_data(State_Type,cur_time);
      const MultiFab& rho = (rho_flag == 1) ? rho_half : S;
      const int Rho_comp = (rho_flag ==1) ? 0 : Density;

      computeAlpha(acoef, scalars, a, b,
                   &rhsscale, alpha, alphaComp,
                   rho_flag, &rho, Rho_comp);
      mlabec.setScalars(scalars.first, scalars.second);
      mlabec.setACoeffs(0, acoef);
    }

    setBeta(mlabec, beta, betaComp, nComp);

    MLMG mlmg(mlabec);
    if (use_hypre) {
      mlmg.setBottomSolver(MLMG::BottomSolver::hypre);
      mlmg.setBottomVerbose(hypre_verbose);
    }
    mlmg.setMaxFmgIter(max_fmg_iter);
    mlmg.setVerbose(verbose);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Rhs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& rhs_arr  = Rhs.array(mfi);
        auto const& rhoh_arr = rho_half.const_array(mfi);
        amrex::ParallelFor(bx, nComp, [=]
        AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
        {
            rhs_arr(i,j,k,n) *= rhsscale;
            if (rho_flag == 1) {
               rhs_arr(i,j,k,n) *= rhoh_arr(i,j,k);
            }
        });
    }

    mlmg.solve({&Soln}, {&Rhs}, S_tol, S_tol_abs);

    int flux_allthere, flux_allnull;
    checkBeta(flux, flux_allthere, flux_allnull);
    if (flux_allthere)
    {
        computeExtensiveFluxes(mlmg, Soln, flux, fluxComp, nComp,
			       navier_stokes->area, b/dt);
    }

    MultiFab::Copy(Ssync,Soln,0,sigma,nComp,0);

    if (verbose > 1)
    {
        for (int comp = 0; comp < nComp; ++comp) {
           Real s_norm = Soln.norm0(comp,Soln.nGrow());
           amrex::Print() << "Final max of Ssync for comp " << comp << ": " << s_norm << '\n';
        }
    }

    if (rho_flag == 2)
    {
        MultiFab& S_new = navier_stokes->get_new_data(State_Type);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
       for (MFIter mfi(S_new, TilingIfNotGPU()); mfi.isValid(); ++mfi)
       {
           const Box& bx = mfi.tilebox();
           auto const& ssync_arr = Ssync.array(mfi,sigma);
           auto const& rho_arr   = S_new.const_array(mfi,Density);
           amrex::ParallelFor(bx, nComp, [ssync_arr, rho_arr]
           AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
           {
               ssync_arr(i,j,k,n) *= rho_arr(i,j,k);
           });
       }
    }

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;
        ParallelDescriptor::ReduceRealMax(run_time,IOProc);
        amrex::Print() << "Diffusion::diffuse_Ssync(): lev: " << level
                       << ", time: " << run_time << '\n';
    }
}